

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O2

void deqp::gles31::Functional::anon_unknown_0::generateProgramOutputBlockContents
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup,
               deUint32 presentShadersMask,bool includeEmpty,
               _func_void_Context_ptr_SharedPtr_ptr_TestCaseGroup_ptr_ProgramInterface_char_ptr
               *genCase)

{
  NodeType NVar1;
  ShaderType SVar2;
  Variable *pVVar3;
  ArrayElement *pAVar4;
  StorageQualifier *pSVar5;
  Node *pNVar6;
  SharedPtr variable_1;
  SharedPtr variable;
  SharedPtr variable_2;
  SharedPtr output;
  
  pNVar6 = parentStructure->m_ptr;
  NVar1 = pNVar6->m_type;
  if (NVar1 == TYPE_DEFAULT_BLOCK) {
    pSVar5 = (StorageQualifier *)operator_new(0x28);
    ResourceDefinition::StorageQualifier::StorageQualifier(pSVar5,parentStructure,STORAGE_OUT);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&output,(Node *)pSVar5);
  }
  else {
    output.m_state = parentStructure->m_state;
    output.m_ptr = pNVar6;
    if (output.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (output.m_state)->strongRefCount = (output.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (output.m_state)->weakRefCount = (output.m_state)->weakRefCount + 1;
      UNLOCK();
    }
  }
  SVar2 = getShaderMaskLastStage(presentShadersMask);
  if (includeEmpty && NVar1 == TYPE_DEFAULT_BLOCK) {
    (*genCase)(context,parentStructure,targetGroup,PROGRAMINTERFACE_PROGRAM_OUTPUT,"empty");
  }
  if (((NVar1 == TYPE_DEFAULT_BLOCK) && (SVar2 != SHADERTYPE_TESSELLATION_EVALUATION)) &&
     ((SVar2 & ~SHADERTYPE_GEOMETRY) != SHADERTYPE_VERTEX)) {
    if (SVar2 == SHADERTYPE_TESSELLATION_CONTROL) {
      pSVar5 = (StorageQualifier *)operator_new(0x28);
      ResourceDefinition::StorageQualifier::StorageQualifier
                (pSVar5,parentStructure,STORAGE_PATCH_OUT);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::SharedPtr(&variable,(Node *)pSVar5);
      pAVar4 = (ArrayElement *)operator_new(0x28);
      ResourceDefinition::ArrayElement::ArrayElement(pAVar4,&output,-2);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::SharedPtr(&variable_1,(Node *)pAVar4);
      pVVar3 = (Variable *)operator_new(0x28);
      ResourceDefinition::Variable::Variable(pVVar3,&variable_1,TYPE_FLOAT_VEC4);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::SharedPtr(&variable_2,(Node *)pVVar3);
      (*genCase)(context,&variable_2,targetGroup,PROGRAMINTERFACE_PROGRAM_OUTPUT,"var");
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::~SharedPtr(&variable_2);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::~SharedPtr(&variable_1);
      pVVar3 = (Variable *)operator_new(0x28);
      ResourceDefinition::Variable::Variable(pVVar3,&variable,TYPE_FLOAT_VEC4);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::SharedPtr(&variable_1,(Node *)pVVar3);
      (*genCase)(context,&variable_1,targetGroup,PROGRAMINTERFACE_PROGRAM_OUTPUT,"patch_var");
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::~SharedPtr(&variable_1);
      pNVar6 = (Node *)operator_new(0x20);
      ResourceDefinition::StructMember::StructMember((StructMember *)pNVar6,&variable);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::SharedPtr(&variable_1,pNVar6);
      pVVar3 = (Variable *)operator_new(0x28);
      ResourceDefinition::Variable::Variable(pVVar3,&variable_1,TYPE_FLOAT_VEC4);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::SharedPtr(&variable_2,(Node *)pVVar3);
      (*genCase)(context,&variable_2,targetGroup,PROGRAMINTERFACE_PROGRAM_OUTPUT,"patch_var_struct")
      ;
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::~SharedPtr(&variable_2);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::~SharedPtr(&variable_1);
      pAVar4 = (ArrayElement *)operator_new(0x28);
      ResourceDefinition::ArrayElement::ArrayElement(pAVar4,&variable,-1);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::SharedPtr(&variable_1,(Node *)pAVar4);
      pVVar3 = (Variable *)operator_new(0x28);
      ResourceDefinition::Variable::Variable(pVVar3,&variable_1,TYPE_FLOAT_VEC4);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::SharedPtr(&variable_2,(Node *)pVVar3);
      (*genCase)(context,&variable_2,targetGroup,PROGRAMINTERFACE_PROGRAM_OUTPUT,"patch_var_array");
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::~SharedPtr(&variable_2);
    }
    else {
      if (SVar2 != SHADERTYPE_FRAGMENT) goto LAB_012fb673;
      pVVar3 = (Variable *)operator_new(0x28);
      ResourceDefinition::Variable::Variable(pVVar3,&output,TYPE_FLOAT_VEC4);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::SharedPtr(&variable,(Node *)pVVar3);
      (*genCase)(context,&variable,targetGroup,PROGRAMINTERFACE_PROGRAM_OUTPUT,"var");
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::~SharedPtr(&variable);
      pAVar4 = (ArrayElement *)operator_new(0x28);
      ResourceDefinition::ArrayElement::ArrayElement(pAVar4,&output,-1);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::SharedPtr(&variable,(Node *)pAVar4);
      pVVar3 = (Variable *)operator_new(0x28);
      ResourceDefinition::Variable::Variable(pVVar3,&variable,TYPE_FLOAT_VEC4);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::SharedPtr(&variable_1,(Node *)pVVar3);
      (*genCase)(context,&variable_1,targetGroup,PROGRAMINTERFACE_PROGRAM_OUTPUT,"var_array");
    }
  }
  else {
    pVVar3 = (Variable *)operator_new(0x28);
    ResourceDefinition::Variable::Variable(pVVar3,&output,TYPE_FLOAT_VEC4);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&variable,(Node *)pVVar3);
    (*genCase)(context,&variable,targetGroup,PROGRAMINTERFACE_PROGRAM_OUTPUT,"var");
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&variable);
    pNVar6 = (Node *)operator_new(0x20);
    ResourceDefinition::StructMember::StructMember((StructMember *)pNVar6,&output);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&variable,pNVar6);
    pVVar3 = (Variable *)operator_new(0x28);
    ResourceDefinition::Variable::Variable(pVVar3,&variable,TYPE_FLOAT_VEC4);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&variable_1,(Node *)pVVar3);
    (*genCase)(context,&variable_1,targetGroup,PROGRAMINTERFACE_PROGRAM_OUTPUT,"var_struct");
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&variable_1);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&variable);
    pAVar4 = (ArrayElement *)operator_new(0x28);
    ResourceDefinition::ArrayElement::ArrayElement(pAVar4,&output,-1);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&variable,(Node *)pAVar4);
    pVVar3 = (Variable *)operator_new(0x28);
    ResourceDefinition::Variable::Variable(pVVar3,&variable,TYPE_FLOAT_VEC4);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&variable_1,(Node *)pVVar3);
    (*genCase)(context,&variable_1,targetGroup,PROGRAMINTERFACE_PROGRAM_OUTPUT,"var_array");
  }
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&variable_1);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&variable);
LAB_012fb673:
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&output);
  return;
}

Assistant:

static void generateProgramOutputBlockContents (Context&										context,
												const ResourceDefinition::Node::SharedPtr&		parentStructure,
												tcu::TestCaseGroup*								targetGroup,
												deUint32										presentShadersMask,
												bool											includeEmpty,
												void											(*genCase)(Context&										context,
																										   const ResourceDefinition::Node::SharedPtr&	parentStructure,
																										   tcu::TestCaseGroup*							targetGroup,
																										   ProgramInterface								interface,
																										   const char*									name))
{
	const bool									inDefaultBlock	= parentStructure->getType() == ResourceDefinition::Node::TYPE_DEFAULT_BLOCK;
	const ResourceDefinition::Node::SharedPtr	output			= (inDefaultBlock)
																	? (ResourceDefinition::Node::SharedPtr(new ResourceDefinition::StorageQualifier(parentStructure, glu::STORAGE_OUT)))
																	: (parentStructure);
	const glu::ShaderType						lastStage		= getShaderMaskLastStage(presentShadersMask);

	// .empty
	if (includeEmpty && inDefaultBlock)
		genCase(context, parentStructure, targetGroup, PROGRAMINTERFACE_PROGRAM_OUTPUT, "empty");

	if (lastStage == glu::SHADERTYPE_VERTEX						||
		lastStage == glu::SHADERTYPE_GEOMETRY					||
		lastStage == glu::SHADERTYPE_TESSELLATION_EVALUATION	||
		!inDefaultBlock)
	{
		// .var
		{
			const ResourceDefinition::Node::SharedPtr variable(new ResourceDefinition::Variable(output, glu::TYPE_FLOAT_VEC4));
			genCase(context, variable, targetGroup, PROGRAMINTERFACE_PROGRAM_OUTPUT, "var");
		}
		// .var_struct
		{
			const ResourceDefinition::Node::SharedPtr structMbr	(new ResourceDefinition::StructMember(output));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(structMbr, glu::TYPE_FLOAT_VEC4));
			genCase(context, variable, targetGroup, PROGRAMINTERFACE_PROGRAM_OUTPUT, "var_struct");
		}
		// .var_array
		{
			const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(output));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(arrayElem, glu::TYPE_FLOAT_VEC4));
			genCase(context, variable, targetGroup, PROGRAMINTERFACE_PROGRAM_OUTPUT, "var_array");
		}
	}
	else if (lastStage == glu::SHADERTYPE_FRAGMENT)
	{
		// .var
		{
			const ResourceDefinition::Node::SharedPtr variable(new ResourceDefinition::Variable(output, glu::TYPE_FLOAT_VEC4));
			genCase(context, variable, targetGroup, PROGRAMINTERFACE_PROGRAM_OUTPUT, "var");
		}
		// .var_array
		{
			const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(output));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(arrayElem, glu::TYPE_FLOAT_VEC4));
			genCase(context, variable, targetGroup, PROGRAMINTERFACE_PROGRAM_OUTPUT, "var_array");
		}
	}
	else if (lastStage == glu::SHADERTYPE_TESSELLATION_CONTROL)
	{
		// arrayed interface
		const ResourceDefinition::Node::SharedPtr patchOutput(new ResourceDefinition::StorageQualifier(parentStructure, glu::STORAGE_PATCH_OUT));

		// .var
		{
			const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(output, ResourceDefinition::ArrayElement::UNSIZED_ARRAY));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(arrayElem, glu::TYPE_FLOAT_VEC4));
			genCase(context, variable, targetGroup, PROGRAMINTERFACE_PROGRAM_OUTPUT, "var");
		}
		// extension forbids use arrays of structs
		// extension forbids use array of arrays

		// .patch_var
		{
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(patchOutput, glu::TYPE_FLOAT_VEC4));
			genCase(context, variable, targetGroup, PROGRAMINTERFACE_PROGRAM_OUTPUT, "patch_var");
		}
		// .patch_var_struct
		{
			const ResourceDefinition::Node::SharedPtr structMbr	(new ResourceDefinition::StructMember(patchOutput));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(structMbr, glu::TYPE_FLOAT_VEC4));
			genCase(context, variable, targetGroup, PROGRAMINTERFACE_PROGRAM_OUTPUT, "patch_var_struct");
		}
		// .patch_var_array
		{
			const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(patchOutput));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(arrayElem, glu::TYPE_FLOAT_VEC4));
			genCase(context, variable, targetGroup, PROGRAMINTERFACE_PROGRAM_OUTPUT, "patch_var_array");
		}
	}
	else if (lastStage == glu::SHADERTYPE_COMPUTE)
	{
		// nada
	}
	else
		DE_ASSERT(false);
}